

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
* __thiscall
jsoncons::jsonpath::detail::
token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::operator=(token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            *this,token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *other)

{
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RSI;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_ffffffffffffffe0;
  
  if (in_RSI != in_RDI) {
    if (in_RDI->token_kind_ == in_RSI->token_kind_) {
      this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                (ulong)(in_RDI->token_kind_ - expression);
      switch(this_00) {
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0:
        std::
        unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        ::operator=((unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                     *)this_00,
                    (unique_ptr<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::default_delete<jsoncons::jsonpath::detail::expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                     *)in_stack_ffffffffffffffd8);
        break;
      default:
        break;
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xb:
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
                  (this_00,in_stack_ffffffffffffffd8);
        break;
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xc:
        (in_RDI->field_1).selector_ = (in_RSI->field_1).selector_;
        break;
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xd:
        (in_RDI->field_1).selector_ = (in_RSI->field_1).selector_;
        break;
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x10:
        (in_RDI->field_1).selector_ = (in_RSI->field_1).selector_;
        break;
      case (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x11:
        (in_RDI->field_1).selector_ = (in_RSI->field_1).selector_;
      }
    }
    else {
      destroy(in_stack_ffffffffffffffe0);
      construct(in_RSI,in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

token& operator=(token&& other) noexcept
        {

            if (&other != this)
            {
                if (token_kind_ == other.token_kind_)
                {
                    switch (token_kind_)
                    {
                        case jsonpath_token_kind::selector:
                            selector_ = other.selector_;
                            break;
                        case jsonpath_token_kind::expression:
                            expression_ = std::move(other.expression_);
                            break;
                        case jsonpath_token_kind::unary_operator:
                            unary_operator_ = other.unary_operator_;
                            break;
                        case jsonpath_token_kind::binary_operator:
                            binary_operator_ = other.binary_operator_;
                            break;
                        case jsonpath_token_kind::function:
                            function_ = other.function_;
                            break;
                        case jsonpath_token_kind::literal:
                            value_ = std::move(other.value_);
                            break;
                        default:
                            break;
                    }
                }
                else
                {
                    destroy();
                    construct(std::move(other));
                }
            }
            return *this;
        }